

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,UnaryNode *node)

{
  UnaryOperator UVar1;
  ExpressionNode *pEVar2;
  Value *pVVar3;
  _Head_base<0UL,_Value_*,_false> _Var4;
  mapped_type *__rhs;
  Executor *this_00;
  double newValue;
  NumberValueAnalyser analyser;
  undefined8 local_60;
  _Head_base<0UL,_Value_*,_false> local_58;
  undefined **local_50;
  undefined1 local_48;
  _Map_pointer local_40;
  char local_38;
  
  pEVar2 = (node->term_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar2->super_Node)._vptr_Node + 0x10))(pEVar2,this);
  pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  local_60 = (_Map_pointer)((ulong)local_60._4_4_ << 0x20);
  __rhs = std::__detail::
          _Map_base<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&UnaryOperationNames_abi_cxx11_,&node->unaryOperator_);
  this_00 = (Executor *)&stack0xffffffffffffffb0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0,"unary operation ",__rhs);
  assertValueType(this_00,pVVar3,(TypeName *)&local_60,(string *)&stack0xffffffffffffffb0,
                  (Node *)node);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  local_50 = &PTR__ValueVisitor_00149c88;
  local_48 = 0;
  local_38 = '\0';
  pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  (*pVVar3->_vptr_Value[3])(pVVar3,&stack0xffffffffffffffb0);
  if (local_38 != '\0') {
    local_60 = local_40;
    UVar1 = node->unaryOperator_;
    if (UVar1 == BinaryNegation) {
      local_60 = (_Map_pointer)(double)~(uint)(long)(double)local_40;
    }
    else if (UVar1 == Minus) {
      local_60 = (_Map_pointer)((ulong)local_40 ^ 0x8000000000000000);
    }
    else if (UVar1 == LogicalNot) {
      local_60 = (_Map_pointer)(-(ulong)((double)local_40 == 0.0) & 0x3ff0000000000000);
    }
    std::make_unique<Number,double&>((double *)&local_58);
    _Var4._M_head_impl = local_58._M_head_impl;
    local_58._M_head_impl = (Value *)0x0;
    pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (pVVar3 != (Value *)0x0) {
      (*pVVar3->_vptr_Value[1])();
      if (local_58._M_head_impl != (Value *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Value[1])();
      }
    }
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::visit(const UnaryNode& node)
{
  node.getTerm().accept(*this);

  assertValueType(*value_, TypeName::F32,
    "unary operation " + UnaryOperationNames.at(node.getOperation()), node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  auto term = analyser.getValue().value();
  auto newValue = term;
  switch(node.getOperation())
  {
    case UnaryOperator::BinaryNegation:
      newValue = ~static_cast<unsigned int>(term);
      break;
    case UnaryOperator::LogicalNot:
      newValue = term == 0 ? 1 : 0;
      break;
    case UnaryOperator::Minus:
      newValue = -term;
      break;
  }

  value_ = std::make_unique<Number>(newValue);
}